

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::shl<unsigned_int>
          (uintwide_t<256U,_unsigned_int,_void,_true> *this,uint n)

{
  sbyte sVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar3 = 8;
  if (n >> 5 < 8) {
    uVar3 = n >> 5;
  }
  if (0x1f < n) {
    for (lVar2 = 0; (ulong)(uVar3 * 4) - 0x20 != lVar2; lVar2 = lVar2 + -4) {
      *(undefined4 *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar2 + 0x1c) =
           *(undefined4 *)((long)this + lVar2 + (0x1c - (ulong)(uVar3 * 4)));
    }
    for (uVar4 = 0; uVar3 * 4 != uVar4; uVar4 = uVar4 + 4) {
      *(undefined4 *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + uVar4) = 0;
    }
  }
  if ((n & 0x1f) != 0) {
    sVar1 = (sbyte)(n & 0x1f);
    uVar5 = 0;
    for (uVar4 = (ulong)(uVar3 << 2); uVar4 != 0x20; uVar4 = uVar4 + 4) {
      uVar3 = *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + uVar4);
      *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + uVar4) =
           uVar3 << sVar1 | uVar5;
      uVar5 = uVar3 >> (0x20U - sVar1 & 0x1f);
    }
  }
  return;
}

Assistant:

constexpr auto shl(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto left_shift_amount = static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(offset > static_cast<unsigned_fast_type>(UINT8_C(0)))
      {
        detail::copy_backward_unsafe(values.cbegin(),
                                     detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs - offset)),
                                     detail::advance_and_point(values.begin(), static_cast<size_t>(number_of_limbs)));

        detail::fill_unsafe(values.begin(), detail::advance_and_point(values.begin(), static_cast<size_t>(offset)), static_cast<limb_type>(UINT8_C(0)));
      }

      using local_integral_type = unsigned_fast_type;

      if(left_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value = static_cast<limb_type>(UINT8_C(0));

        auto ai = detail::advance_and_point(values.begin(), offset); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        while(ai != values.end()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *ai;

          *ai++ =
            static_cast<limb_type>
            (
                static_cast<limb_type>(t << static_cast<local_integral_type>(left_shift_amount))
              | part_from_previous_value
            );

          const auto right_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(left_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t >> right_shift_previous_value);
        }
      }
    }